

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::TypeValidator<double>::TypeValidator(TypeValidator<double> *this,string *validator_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  anon_class_1_0_00000001 *__f;
  undefined8 in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  Validator *in_stack_ffffffffffffffd0;
  
  __f = (anon_class_1_0_00000001 *)&stack0xffffffffffffffd0;
  ::std::__cxx11::string::string
            (in_stack_ffffffffffffffc0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffb8);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::
  function<CLI::TypeValidator<double>::TypeValidator(std::__cxx11::string_const&)::_lambda(std::__cxx11::string&)_1_,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&stack0xffffffffffffffb0,__f);
  Validator::Validator
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_ffffffffffffffc0);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x1814a9);
  ::std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

explicit TypeValidator(const std::string &validator_name)
        : Validator(validator_name, [](std::string &input_string) {
              using CLI::detail::lexical_cast;
              auto val = DesiredType();
              if(!lexical_cast(input_string, val)) {
                  return std::string("Failed parsing ") + input_string + " as a " + detail::type_name<DesiredType>();
              }
              return std::string();
          }) {}